

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O3

void gf256_mul_mem(void *vz,void *vx,uint8_t y,int bytes)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 *puVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  undefined7 in_register_00000011;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  
  if (y < 2) {
    if (y == '\0') {
      memset(vz,0,(long)bytes);
      return;
    }
    if (vz != vx) {
      memcpy(vz,vx,(long)bytes);
      return;
    }
    return;
  }
  iVar16 = (int)CONCAT71(in_register_00000011,y);
  if (bytes < 0x20) {
LAB_00102a49:
    uVar18 = bytes;
    if (0xf < bytes) goto LAB_00102a50;
LAB_00102ab7:
    lVar17 = (ulong)(uint)(iVar16 << 8) + 0x114120;
    uVar18 = bytes;
    if (bytes < 8) goto LAB_00102b83;
  }
  else {
    uVar18 = bytes;
    if (CpuHasAVX2) {
      auVar20[8] = 0xf;
      auVar20._0_8_ = 0xf0f0f0f0f0f0f0f;
      auVar20[9] = 0xf;
      auVar20[10] = 0xf;
      auVar20[0xb] = 0xf;
      auVar20[0xc] = 0xf;
      auVar20[0xd] = 0xf;
      auVar20[0xe] = 0xf;
      auVar20[0xf] = 0xf;
      auVar20[0x10] = 0xf;
      auVar20[0x11] = 0xf;
      auVar20[0x12] = 0xf;
      auVar20[0x13] = 0xf;
      auVar20[0x14] = 0xf;
      auVar20[0x15] = 0xf;
      auVar20[0x16] = 0xf;
      auVar20[0x17] = 0xf;
      auVar20[0x18] = 0xf;
      auVar20[0x19] = 0xf;
      auVar20[0x1a] = 0xf;
      auVar20[0x1b] = 0xf;
      auVar20[0x1c] = 0xf;
      auVar20[0x1d] = 0xf;
      auVar20[0x1e] = 0xf;
      auVar20[0x1f] = 0xf;
      auVar3 = *(undefined1 (*) [32])
                ((long)GF256Ctx.MM256.TABLE_LO_Y[0] + (ulong)(uint)(iVar16 << 5));
      auVar4 = *(undefined1 (*) [32])
                ((long)GF256Ctx.MM256.TABLE_HI_Y[0] + (ulong)(uint)(iVar16 << 5));
      do {
        auVar5 = *vx;
        bytes = uVar18 - 0x20;
        vx = (void *)((long)vx + 0x20);
        auVar22 = vpsrlq_avx2(auVar5,4);
        auVar5 = vpand_avx2(auVar5,auVar20);
        auVar22 = vpand_avx2(auVar22,auVar20);
        auVar5 = vpshufb_avx2(auVar3,auVar5);
        auVar22 = vpshufb_avx2(auVar4,auVar22);
        *(undefined1 (*) [32])vz = auVar22 ^ auVar5;
        vz = (void *)((long)vz + 0x20);
        bVar6 = 0x3f < uVar18;
        uVar18 = bytes;
      } while (bVar6);
      goto LAB_00102a49;
    }
LAB_00102a50:
    if (CpuHasSSSE3 != false) {
      auVar19[8] = 0xf;
      auVar19._0_8_ = 0xf0f0f0f0f0f0f0f;
      auVar19[9] = 0xf;
      auVar19[10] = 0xf;
      auVar19[0xb] = 0xf;
      auVar19[0xc] = 0xf;
      auVar19[0xd] = 0xf;
      auVar19[0xe] = 0xf;
      auVar19[0xf] = 0xf;
      auVar1 = *(undefined1 (*) [16])
                ((long)GF256Ctx.MM128.TABLE_LO_Y[0] + (ulong)(uint)(iVar16 << 4));
      auVar2 = *(undefined1 (*) [16])
                ((long)GF256Ctx.MM128.TABLE_HI_Y[0] + (ulong)(uint)(iVar16 << 4));
      do {
        puVar8 = *(undefined1 (*) [32])vx;
        bytes = uVar18 - 0x10;
        vx = *(undefined1 (*) [32])vx + 0x10;
        auVar21 = vpsrlq_avx(*(undefined1 (*) [16])puVar8,4);
        auVar7 = vpand_avx(*(undefined1 (*) [16])puVar8,auVar19);
        auVar21 = vpand_avx(auVar21,auVar19);
        auVar7 = vpshufb_avx(auVar1,auVar7);
        auVar21 = vpshufb_avx(auVar2,auVar21);
        *(undefined1 (*) [16])*(undefined1 (*) [32])vz = auVar21 ^ auVar7;
        vz = *(undefined1 (*) [32])vz + 0x10;
        bVar6 = 0x1f < uVar18;
        uVar18 = bytes;
      } while (bVar6);
      goto LAB_00102ab7;
    }
    lVar17 = (ulong)(uint)(iVar16 << 8) + 0x114120;
  }
  do {
    puVar8 = *(undefined1 (*) [32])vx;
    puVar9 = *(undefined1 (*) [32])vx;
    puVar10 = *(undefined1 (*) [32])vx;
    puVar11 = *(undefined1 (*) [32])vx;
    puVar12 = *(undefined1 (*) [32])vx;
    puVar13 = *(undefined1 (*) [32])vx;
    puVar14 = *(undefined1 (*) [32])vx;
    puVar15 = *(undefined1 (*) [32])vx;
    vx = *(undefined1 (*) [32])vx + 8;
    bytes = uVar18 - 8;
    *(ulong *)*(undefined1 (*) [32])vz =
         CONCAT17(*(undefined1 *)(lVar17 + (ulong)(byte)puVar15[7]),
                  CONCAT16(*(undefined1 *)(lVar17 + (ulong)(byte)puVar14[6]),
                           CONCAT15(*(undefined1 *)(lVar17 + (ulong)(byte)puVar13[5]),
                                    CONCAT14(*(undefined1 *)(lVar17 + (ulong)(byte)puVar12[4]),
                                             CONCAT13(*(undefined1 *)
                                                       (lVar17 + (ulong)(byte)puVar11[3]),
                                                      CONCAT12(*(undefined1 *)
                                                                (lVar17 + (ulong)(byte)puVar10[2]),
                                                               CONCAT11(*(undefined1 *)
                                                                         (lVar17 + (ulong)(byte)
                                                  puVar8[1]),
                                                  *(undefined1 *)(lVar17 + (ulong)(byte)*puVar9)))))
                                   )));
    vz = *(undefined1 (*) [32])vz + 8;
    bVar6 = 0xf < uVar18;
    uVar18 = bytes;
  } while (bVar6);
LAB_00102b83:
  uVar18 = bytes & 4;
  if (uVar18 != 0) {
    *(uint *)*(undefined1 (*) [32])vz =
         CONCAT13(*(undefined1 *)(lVar17 + (ulong)(byte)(*(undefined1 (*) [32])vx)[3]),
                  CONCAT12(*(undefined1 *)(lVar17 + (ulong)(byte)(*(undefined1 (*) [32])vx)[2]),
                           CONCAT11(*(undefined1 *)
                                     (lVar17 + (ulong)(byte)(*(undefined1 (*) [32])vx)[1]),
                                    *(undefined1 *)
                                     (lVar17 + (ulong)(byte)(*(undefined1 (*) [32])vx)[0]))));
  }
  switch(bytes & 3) {
  case 0:
    return;
  case 3:
    (*(undefined1 (*) [32])vz)[(ulong)uVar18 + 2] =
         *(undefined1 *)(lVar17 + (ulong)(byte)(*(undefined1 (*) [32])vx)[(ulong)uVar18 + 2]);
  case 2:
    (*(undefined1 (*) [32])vz)[(ulong)uVar18 + 1] =
         *(undefined1 *)(lVar17 + (ulong)(byte)(*(undefined1 (*) [32])vx)[(ulong)uVar18 + 1]);
  case 1:
    (*(undefined1 (*) [32])vz)[uVar18] =
         *(undefined1 *)(lVar17 + (ulong)(byte)(*(undefined1 (*) [32])vx)[uVar18]);
    return;
  }
}

Assistant:

void gf256_mul_mem(void * GF256_RESTRICT vz, const void * GF256_RESTRICT vx, uint8_t y, int bytes)
{
    // Use a single if-statement to handle special cases
    if (y <= 1)
    {
        if (y == 0)
            memset(vz, 0, bytes);
        else if (vz != vx)
            memcpy(vz, vx, bytes);
        return;
    }

    GF256_M128 * GF256_RESTRICT z16 = reinterpret_cast<GF256_M128 *>(vz);
    const GF256_M128 * GF256_RESTRICT x16 = reinterpret_cast<const GF256_M128 *>(vx);

#if defined(GF256_TARGET_MOBILE)
#if defined(GF256_TRY_NEON)
    if (bytes >= 16 && CpuHasNeon)
    {
        // Partial product tables; see above
        const GF256_M128 table_lo_y = vld1q_u8((uint8_t*)(GF256Ctx.MM128.TABLE_LO_Y + y));
        const GF256_M128 table_hi_y = vld1q_u8((uint8_t*)(GF256Ctx.MM128.TABLE_HI_Y + y));

        // clr_mask = 0x0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f
        const GF256_M128 clr_mask = vdupq_n_u8(0x0f);

        // Handle multiples of 16 bytes
        do
        {
            // See above comments for details
            GF256_M128 x0 = vld1q_u8((uint8_t*)x16);
            GF256_M128 l0 = vandq_u8(x0, clr_mask);
            x0 = vshrq_n_u8(x0, 4);
            GF256_M128 h0 = vandq_u8(x0, clr_mask);
            l0 = vqtbl1q_u8(table_lo_y, l0);
            h0 = vqtbl1q_u8(table_hi_y, h0);
            vst1q_u8((uint8_t*)z16, veorq_u8(l0, h0));

            bytes -= 16, ++x16, ++z16;
        } while (bytes >= 16);
    }
#endif
#else
# if defined(GF256_TRY_AVX2)
    if (bytes >= 32 && CpuHasAVX2)
    {
        // Partial product tables; see above
        const GF256_M256 table_lo_y = _mm256_loadu_si256(GF256Ctx.MM256.TABLE_LO_Y + y);
        const GF256_M256 table_hi_y = _mm256_loadu_si256(GF256Ctx.MM256.TABLE_HI_Y + y);

        // clr_mask = 0x0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f
        const GF256_M256 clr_mask = _mm256_set1_epi8(0x0f);

        GF256_M256 * GF256_RESTRICT z32 = reinterpret_cast<GF256_M256 *>(vz);
        const GF256_M256 * GF256_RESTRICT x32 = reinterpret_cast<const GF256_M256 *>(vx);

        // Handle multiples of 32 bytes
        do
        {
            // See above comments for details
            GF256_M256 x0 = _mm256_loadu_si256(x32);
            GF256_M256 l0 = _mm256_and_si256(x0, clr_mask);
            x0 = _mm256_srli_epi64(x0, 4);
            GF256_M256 h0 = _mm256_and_si256(x0, clr_mask);
            l0 = _mm256_shuffle_epi8(table_lo_y, l0);
            h0 = _mm256_shuffle_epi8(table_hi_y, h0);
            _mm256_storeu_si256(z32, _mm256_xor_si256(l0, h0));

            bytes -= 32, ++x32, ++z32;
        } while (bytes >= 32);

        z16 = reinterpret_cast<GF256_M128 *>(z32);
        x16 = reinterpret_cast<const GF256_M128 *>(x32);
    }
# endif // GF256_TRY_AVX2
    if (bytes >= 16 && CpuHasSSSE3)
    {
        // Partial product tables; see above
        const GF256_M128 table_lo_y = _mm_loadu_si128(GF256Ctx.MM128.TABLE_LO_Y + y);
        const GF256_M128 table_hi_y = _mm_loadu_si128(GF256Ctx.MM128.TABLE_HI_Y + y);

        // clr_mask = 0x0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f
        const GF256_M128 clr_mask = _mm_set1_epi8(0x0f);

        // Handle multiples of 16 bytes
        do
        {
            // See above comments for details
            GF256_M128 x0 = _mm_loadu_si128(x16);
            GF256_M128 l0 = _mm_and_si128(x0, clr_mask);
            x0 = _mm_srli_epi64(x0, 4);
            GF256_M128 h0 = _mm_and_si128(x0, clr_mask);
            l0 = _mm_shuffle_epi8(table_lo_y, l0);
            h0 = _mm_shuffle_epi8(table_hi_y, h0);
            _mm_storeu_si128(z16, _mm_xor_si128(l0, h0));

            bytes -= 16, ++x16, ++z16;
        } while (bytes >= 16);
    }
#endif

    uint8_t * GF256_RESTRICT z1 = reinterpret_cast<uint8_t*>(z16);
    const uint8_t * GF256_RESTRICT x1 = reinterpret_cast<const uint8_t*>(x16);
    const uint8_t * GF256_RESTRICT table = GF256Ctx.GF256_MUL_TABLE + ((unsigned)y << 8);

    // Handle blocks of 8 bytes
    while (bytes >= 8)
    {
        uint64_t * GF256_RESTRICT z8 = reinterpret_cast<uint64_t *>(z1);
#ifdef GF256_IS_BIG_ENDIAN
        uint64_t word = (uint64_t)table[x1[0]] << 56;
        word |= (uint64_t)table[x1[1]] << 48;
        word |= (uint64_t)table[x1[2]] << 40;
        word |= (uint64_t)table[x1[3]] << 32;
        word |= (uint64_t)table[x1[4]] << 24;
        word |= (uint64_t)table[x1[5]] << 16;
        word |= (uint64_t)table[x1[6]] << 8;
        word |= (uint64_t)table[x1[7]];
#else
        uint64_t word = table[x1[0]];
        word |= (uint64_t)table[x1[1]] << 8;
        word |= (uint64_t)table[x1[2]] << 16;
        word |= (uint64_t)table[x1[3]] << 24;
        word |= (uint64_t)table[x1[4]] << 32;
        word |= (uint64_t)table[x1[5]] << 40;
        word |= (uint64_t)table[x1[6]] << 48;
        word |= (uint64_t)table[x1[7]] << 56;
#endif
        *z8 = word;

        bytes -= 8, x1 += 8, z1 += 8;
    }

    // Handle a block of 4 bytes
    const int four = bytes & 4;
    if (four)
    {
        uint32_t * GF256_RESTRICT z4 = reinterpret_cast<uint32_t *>(z1);
#ifdef GF256_IS_BIG_ENDIAN
        uint32_t word = (uint32_t)table[x1[0]] << 24;
        word |= (uint32_t)table[x1[1]] << 16;
        word |= (uint32_t)table[x1[2]] << 8;
        word |= (uint32_t)table[x1[3]];
#else
        uint32_t word = table[x1[0]];
        word |= (uint32_t)table[x1[1]] << 8;
        word |= (uint32_t)table[x1[2]] << 16;
        word |= (uint32_t)table[x1[3]] << 24;
#endif
        *z4 = word;
    }

    // Handle single bytes
    const int offset = four;
    switch (bytes & 3)
    {
    case 3: z1[offset + 2] = table[x1[offset + 2]];
    case 2: z1[offset + 1] = table[x1[offset + 1]];
    case 1: z1[offset] = table[x1[offset]];
    default:
        break;
    }
}